

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O1

int mod2sparse_count_col(mod2sparse *m,int col)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int extraout_EAX;
  mod2entry *pmVar9;
  mod2entry *extraout_RAX;
  mod2sparse *pmVar10;
  void *pvVar11;
  void *__ptr;
  mod2sparse *r;
  mod2sparse *pmVar12;
  long lVar13;
  long lVar14;
  mod2entry *pmVar15;
  FILE *pFVar16;
  undefined8 *puVar17;
  int *piVar18;
  mod2sparse *in_RCX;
  mod2sparse *pmVar19;
  uint col_00;
  int *extraout_RDX;
  int *extraout_RDX_00;
  mod2sparse *r_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  mod2sparse *pmVar20;
  uint uVar21;
  uint uVar22;
  undefined4 in_register_00000034;
  mod2sparse *pmVar23;
  mod2sparse *__modes;
  long in_R8;
  ulong uVar24;
  long in_R9;
  ulong uVar25;
  ulong in_R10;
  long lVar26;
  byte bVar27;
  uint unaff_R12D;
  mod2entry *pmVar28;
  uint *puVar29;
  uint unaff_R13D;
  mod2entry *pmVar30;
  int iVar31;
  mod2sparse *unaff_R14;
  uint uStack_128;
  mod2entry *pmStack_100;
  int iStack_f0;
  uint uStack_ec;
  void *pvStack_e8;
  void *pvStack_d0;
  int iStack_ac;
  
  pmVar23 = (mod2sparse *)CONCAT44(in_register_00000034,col);
  if ((-1 < col) && (col < m->n_cols)) {
    pmVar15 = m->cols[(uint)col].down;
    if (pmVar15->row < 0) {
      iVar6 = 0;
    }
    else {
      iVar6 = 0;
      do {
        iVar6 = iVar6 + 1;
        pmVar15 = pmVar15->down;
      } while (-1 < pmVar15->row);
    }
    return iVar6;
  }
  mod2sparse_count_col_cold_1();
  if (extraout_RDX[1] <= m->n_cols) {
    iVar6 = (int)pmVar23;
    if ((((-1 < iVar6) && (-1 < (int)in_RCX)) && (unaff_R14 = m, iVar6 < m->n_rows)) &&
       ((int)in_RCX < *extraout_RDX)) {
      pmVar15 = m->rows[(ulong)pmVar23 & 0xffffffff].right;
      pmVar9 = *(mod2entry **)(extraout_RDX + 2);
      pmVar28 = pmVar9[(ulong)in_RCX & 0xffffffff].right;
      iVar7 = pmVar15->row;
      do {
        if ((iVar7 < 0) || (pmVar28->row < 0)) {
          for (; -1 < pmVar28->row; pmVar28 = pmVar28->right) {
            pmVar9 = mod2sparse_insert(m,iVar6,pmVar28->col);
          }
          return (int)pmVar9;
        }
        iVar7 = pmVar28->col;
        if (iVar7 < pmVar15->col) {
          pmVar9 = mod2sparse_insert(m,iVar6,iVar7);
          pmVar30 = pmVar15;
LAB_001224b0:
          pmVar28 = pmVar28->right;
        }
        else {
          pmVar30 = pmVar15->right;
          if (pmVar15->col == iVar7) {
            mod2sparse_delete(m,pmVar15);
            pmVar9 = extraout_RAX;
            goto LAB_001224b0;
          }
        }
        iVar7 = pmVar30->row;
        pmVar15 = pmVar30;
      } while( true );
    }
    mod2sparse_add_row_cold_1();
  }
  mod2sparse_add_row_cold_2();
  if (*extraout_RDX_00 <= m->n_rows) {
    iVar6 = (int)pmVar23;
    if (((-1 < iVar6) && (-1 < (int)in_RCX)) &&
       ((iVar6 < m->n_cols && ((int)in_RCX < extraout_RDX_00[1])))) {
      pmVar15 = m->cols[(ulong)pmVar23 & 0xffffffff].down;
      puVar29 = *(uint **)(*(long *)(extraout_RDX_00 + 4) + 0x20 +
                          ((ulong)in_RCX & 0xffffffff) * 0x38);
      uVar22 = pmVar15->row;
      do {
        pmVar9 = (mod2entry *)(ulong)uVar22;
        if (((int)uVar22 < 0) || (uVar2 = *puVar29, (int)uVar2 < 0)) {
          for (; -1 < (int)*puVar29; puVar29 = *(uint **)(puVar29 + 8)) {
            pmVar9 = mod2sparse_insert(m,*puVar29,iVar6);
          }
          return (int)pmVar9;
        }
        if ((int)uVar2 < (int)uVar22) {
          mod2sparse_insert(m,uVar2,iVar6);
          pmVar9 = pmVar15;
LAB_0012257b:
          puVar29 = *(uint **)(puVar29 + 8);
        }
        else {
          pmVar9 = pmVar15->down;
          if (uVar22 == uVar2) {
            mod2sparse_delete(m,pmVar15);
            goto LAB_0012257b;
          }
        }
        uVar22 = pmVar9->row;
        pmVar15 = pmVar9;
      } while( true );
    }
    mod2sparse_add_col_cold_1();
  }
  mod2sparse_add_col_cold_2();
  iVar6 = (int)pmVar23;
  pmVar19 = in_RCX;
  if (r_00->n_cols == iVar6) {
    uVar22 = m->n_rows;
    pmVar10 = (mod2sparse *)(ulong)uVar22;
    if (r_00->n_rows != uVar22) goto LAB_00122d55;
    uVar2 = m->n_cols;
    pmVar19 = (mod2sparse *)(long)(int)uVar2;
    if ((in_RCX->n_cols != uVar2) || (in_RCX->n_rows != iVar6)) goto LAB_00122d55;
    __modes = (mod2sparse *)(ulong)uVar2;
    pmVar12 = pmVar19;
    pmVar20 = m;
    if ((int)unaff_R13D <= (int)(uVar2 - iVar6)) {
      pvVar11 = chk_alloc(uVar22,4);
      __ptr = chk_alloc(uVar2,4);
      if (0 < (int)unaff_R13D) {
        pvStack_d0 = chk_alloc(uVar22 + 1,4);
      }
      if (unaff_R12D == 2) {
        pvStack_e8 = chk_alloc(uVar22,4);
      }
      mod2sparse_clear(r_00);
      mod2sparse_clear(in_RCX);
      r = mod2sparse_allocate(uVar22,uVar2);
      mod2sparse_copy(m,r);
      if (0 < (int)uVar22 && unaff_R12D == 2) {
        m = (mod2sparse *)0x0;
        do {
          pmVar20 = r;
          iVar7 = mod2sparse_count_row(r,(int)m);
          *(int *)((long)pvStack_e8 + (long)m * 4) = iVar7;
          m = (mod2sparse *)((long)&m->n_rows + 1);
        } while (pmVar10 != m);
      }
      if (0 < (int)uVar22) {
        pmVar12 = (mod2sparse *)0x0;
        do {
          *(int *)((long)pvVar11 + (long)pmVar12 * 4) = (int)pmVar12;
          *(int *)(in_R8 + (long)pmVar12 * 4) = (int)pmVar12;
          pmVar12 = (mod2sparse *)((long)&pmVar12->n_rows + 1);
        } while (pmVar10 != pmVar12);
      }
      if (0 < (int)uVar2) {
        pmVar12 = (mod2sparse *)0x0;
        do {
          *(int *)((long)__ptr + (long)pmVar12 * 4) = (int)pmVar12;
          *(int *)(in_R9 + (long)pmVar12 * 4) = (int)pmVar12;
          pmVar12 = (mod2sparse *)((long)&pmVar12->n_rows + 1);
        } while (__modes != pmVar12);
      }
      if (iVar6 < 1) {
        iStack_f0 = 0;
LAB_00122cbd:
        if (iVar6 < (int)uVar22) {
          lVar13 = (long)iVar6;
          do {
            while (pmVar15 = r_00->rows[*(int *)(in_R8 + lVar13 * 4)].right, -1 < pmVar15->row) {
              mod2sparse_delete(r_00,pmVar15);
            }
            lVar13 = lVar13 + 1;
          } while (uVar22 != (uint)lVar13);
        }
        mod2sparse_free(r);
        free(pvVar11);
        free(__ptr);
        if (unaff_R12D == 2) {
          free(pvStack_e8);
        }
        if (0 < (int)unaff_R13D) {
          free(pvStack_d0);
        }
        return iStack_f0;
      }
      pmVar12 = (mod2sparse *)(ulong)unaff_R12D;
      if (unaff_R12D < 3) {
        pmVar12 = (mod2sparse *)0x0;
        iStack_f0 = 0;
        do {
          uStack_128 = (uint)in_R10;
          if (unaff_R12D == 0) {
            bVar5 = false;
            if ((long)pmVar19 <= (long)pmVar12) {
              m = (mod2sparse *)((ulong)pmVar12 & 0xffffffff);
              goto LAB_001229a8;
            }
            m = pmVar12;
            do {
              for (pmStack_100 = r->cols[*(int *)(in_R9 + (long)m * 4)].down; -1 < pmStack_100->row;
                  pmStack_100 = pmStack_100->down) {
                if ((long)pmVar12 <=
                    (long)*(int *)((long)pvVar11 + (ulong)(uint)pmStack_100->row * 4)) {
                  bVar5 = true;
                  goto LAB_001229b7;
                }
              }
              m = (mod2sparse *)((long)&m->n_rows + 1);
            } while (m != __modes);
          }
          else if (unaff_R12D == 1) {
            if ((long)pmVar12 < (long)pmVar19) {
              bVar5 = false;
              pmVar20 = pmVar12;
              do {
                uVar8 = mod2sparse_count_col(r,*(int *)(in_R9 + (long)pmVar20 * 4));
                if ((bVar5) && ((int)uStack_128 <= (int)uVar8)) {
                  bVar5 = true;
                }
                else {
                  pmVar15 = r->cols[*(int *)(in_R9 + (long)pmVar20 * 4)].down;
                  uVar21 = pmVar15->row;
                  while (-1 < (int)uVar21) {
                    if ((long)pmVar12 <= (long)*(int *)((long)pvVar11 + (ulong)uVar21 * 4)) {
                      m = (mod2sparse *)((ulong)pmVar20 & 0xffffffff);
                      bVar5 = true;
                      uStack_128 = uVar8;
                      pmStack_100 = pmVar15;
                      break;
                    }
                    pmVar15 = pmVar15->down;
                    uVar21 = pmVar15->row;
                  }
                }
                pmVar20 = (mod2sparse *)((long)&pmVar20->n_rows + 1);
              } while (pmVar20 != __modes);
            }
            else {
LAB_001229a8:
              bVar5 = false;
            }
          }
          else {
            if ((long)pmVar19 <= (long)pmVar12) goto LAB_001229a8;
            bVar5 = false;
            pmVar20 = pmVar12;
            do {
              iVar7 = mod2sparse_count_col(r,*(int *)(in_R9 + (long)pmVar20 * 4));
              pmVar15 = r->cols[*(int *)(in_R9 + (long)pmVar20 * 4)].down;
              uVar8 = pmVar15->row;
              if (-1 < (int)uVar8) {
                do {
                  if (((long)pmVar12 <= (long)*(int *)((long)pvVar11 + (ulong)uVar8 * 4)) &&
                     (((iVar31 = *(int *)((long)pvStack_e8 + (ulong)uVar8 * 4), !bVar5 ||
                       (iVar7 == 1)) || (bVar5 = true, (iVar31 + -1) * (iVar7 + -1) < iStack_ac))))
                  {
                    iStack_ac = (iVar31 + -1) * (iVar7 + -1);
                    if (iVar7 == 1) {
                      iStack_ac = 0;
                    }
                    bVar5 = true;
                    m = (mod2sparse *)((ulong)pmVar20 & 0xffffffff);
                    pmStack_100 = pmVar15;
                  }
                  pmVar15 = pmVar15->down;
                  uVar8 = pmVar15->row;
                } while (-1 < (int)uVar8);
              }
              pmVar20 = (mod2sparse *)((long)&pmVar20->n_rows + 1);
            } while (pmVar20 != __modes);
          }
LAB_001229b7:
          uVar8 = (uint)pmVar12;
          if (bVar5) {
            iVar7 = (int)m;
            if (*(int *)((long)__ptr + (long)pmStack_100->col * 4) != iVar7) goto LAB_00122d50;
            *(undefined4 *)(in_R9 + (long)iVar7 * 4) = *(undefined4 *)(in_R9 + (long)pmVar12 * 4);
            *(int *)(in_R9 + (long)pmVar12 * 4) = pmStack_100->col;
            *(int *)((long)__ptr + (long)*(int *)(in_R9 + (long)iVar7 * 4) * 4) = iVar7;
            *(uint *)((long)__ptr + (long)*(int *)(in_R9 + (long)pmVar12 * 4) * 4) = uVar8;
            uVar21 = *(uint *)((long)pvVar11 + (long)pmStack_100->row * 4);
            m = (mod2sparse *)(ulong)uVar21;
            lVar13 = (long)(int)uVar21;
            if (lVar13 < (long)pmVar12) goto LAB_00122d50;
            *(undefined4 *)(in_R8 + lVar13 * 4) = *(undefined4 *)(in_R8 + (long)pmVar12 * 4);
            *(int *)(in_R8 + (long)pmVar12 * 4) = pmStack_100->row;
            *(uint *)((long)pvVar11 + (long)*(int *)(in_R8 + lVar13 * 4) * 4) = uVar21;
            *(uint *)((long)pvVar11 + (long)*(int *)(in_R8 + (long)pmVar12 * 4) * 4) = uVar8;
          }
          pmVar15 = r->cols[*(int *)(in_R9 + (long)pmVar12 * 4)].down;
          uVar21 = pmVar15->row;
          while (-1 < (int)uVar21) {
            m = (mod2sparse *)(ulong)uVar21;
            pmVar15 = pmVar15->down;
            uVar3 = *(uint *)((long)pvVar11 + (ulong)uVar21 * 4);
            if ((long)pmVar12 < (long)(int)uVar3) {
              mod2sparse_add_row(r,uVar21,r,pmStack_100->row);
              pmVar20 = r_00;
              col_00 = uVar8;
              if (unaff_R12D == 2) {
                iVar7 = mod2sparse_count_row(r,uVar21);
                *(int *)((long)pvStack_e8 + (ulong)uVar21 * 4) = iVar7;
              }
            }
            else {
              pmVar20 = in_RCX;
              if ((long)(int)uVar3 < (long)pmVar12) {
                col_00 = *(uint *)(in_R9 + (long)pmVar12 * 4);
                uVar21 = uVar3;
              }
              else {
                mod2sparse_insert(r_00,uVar21,uVar8);
                col_00 = *(uint *)(in_R9 + (long)pmVar12 * 4);
                uVar21 = uVar8;
              }
            }
            mod2sparse_insert(pmVar20,uVar21,col_00);
            uVar21 = pmVar15->row;
          }
          pmVar15 = r->cols;
          while (-1 < (pmVar15[*(int *)(in_R9 + (long)pmVar12 * 4)].down)->row) {
            mod2sparse_delete(r,pmVar15[*(int *)(in_R9 + (long)pmVar12 * 4)].down);
            pmVar15 = r->cols;
          }
          if (pmVar12 == (mod2sparse *)((ulong)unaff_R14 & 0xffffffff) && 0 < (int)unaff_R13D) {
            if (-1 < (int)uVar22) {
              memset(pvStack_d0,0,(ulong)(uVar22 + 1) << 2);
            }
            lVar13 = (long)(int)uVar22 + 1;
            m = pmVar10;
            uStack_128 = unaff_R13D;
            if (0 < (int)uVar2) {
              uVar8 = 0;
              do {
                iVar7 = mod2sparse_count_col(r,uVar8);
                piVar18 = (int *)((long)pvStack_d0 + (long)iVar7 * 4);
                *piVar18 = *piVar18 + 1;
                uVar8 = uVar8 + 1;
              } while (uVar2 != uVar8);
            }
            while( true ) {
              iVar7 = *(int *)((long)pvStack_d0 + lVar13 * 4 + -4);
              uVar8 = uStack_128 - iVar7;
              iVar31 = (int)m;
              if (uVar8 == 0 || (int)uStack_128 < iVar7) break;
              lVar14 = lVar13 + -1;
              bVar4 = lVar13 < 1;
              lVar13 = lVar14;
              m = (mod2sparse *)(ulong)(iVar31 - 1);
              uStack_128 = uVar8;
              if (lVar14 == 0 || bVar4) goto LAB_00122d50;
            }
            if ((int)uVar2 < 1) {
              uStack_ec = 0;
            }
            else {
              pmVar20 = (mod2sparse *)0x0;
              uStack_ec = 0;
              do {
                iVar7 = mod2sparse_count_col(r,(int)pmVar20);
                if ((iVar31 < iVar7) || ((iVar7 == iVar31 && (0 < (int)uStack_128)))) {
                  pmVar15 = r->cols;
                  while (-1 < (pmVar15[(long)pmVar20].down)->row) {
                    mod2sparse_delete(r,pmVar15[(long)pmVar20].down);
                    pmVar15 = r->cols;
                  }
                  uStack_128 = uStack_128 - (iVar7 == iVar31);
                  uStack_ec = uStack_ec + 1;
                }
                pmVar20 = (mod2sparse *)((long)&pmVar20->n_rows + 1);
              } while (pmVar20 != pmVar19);
            }
            if (uStack_ec != unaff_R13D) {
LAB_00122d50:
              abort();
            }
            if (unaff_R12D == 2 && 0 < (int)uVar22) {
              pmVar20 = (mod2sparse *)0x0;
              do {
                iVar7 = mod2sparse_count_row(r,(int)pmVar20);
                *(int *)((long)pvStack_e8 + (long)pmVar20 * 4) = iVar7;
                pmVar20 = (mod2sparse *)((long)&pmVar20->n_rows + 1);
              } while (pmVar10 != pmVar20);
            }
          }
          iStack_f0 = iStack_f0 + (uint)!bVar5;
          pmVar12 = (mod2sparse *)((long)&pmVar12->n_rows + 1);
          in_R10 = (ulong)uStack_128;
        } while (pmVar12 != (mod2sparse *)((ulong)pmVar23 & 0xffffffff));
        goto LAB_00122cbd;
      }
      goto LAB_00122d5f;
    }
  }
  else {
LAB_00122d55:
    mod2sparse_decomp_cold_1();
    pmVar12 = pmVar19;
    pmVar20 = m;
  }
  __modes = pmVar23;
  mod2sparse_decomp_cold_3();
LAB_00122d5f:
  mod2sparse_decomp_cold_2();
  uVar24 = (ulong)pmVar20->n_cols;
  if (0 < (long)uVar24) {
    uVar25 = 0;
    do {
      if (__modes == (mod2sparse *)0x0) {
        iVar6 = (int)uVar25;
      }
      else {
        iVar6 = (&__modes->n_rows)[uVar25];
      }
      pmVar15 = pmVar20->rows[iVar6].left;
      if ((-1 < pmVar15->row) && ((long)uVar25 < (long)pmVar15->col)) {
        mod2sparse_forward_sub_cold_1();
        lVar13 = (long)pmVar20->n_rows;
        if (0 < lVar13) {
          lVar14 = 0;
          do {
            if (__modes == (mod2sparse *)0x0) {
              iVar6 = (int)lVar14;
            }
            else {
              iVar6 = (&__modes->n_rows)[lVar14];
            }
            lVar26 = (long)(pmVar20->cols[iVar6].up)->row;
            if (lVar14 < lVar26 && -1 < lVar26) {
              mod2sparse_backward_sub_cold_1();
              uVar22 = 0x127f60;
              iVar6 = strcmp((char *)pmVar20,"-");
              if (iVar6 != 0) {
                pFVar16 = fopen((char *)pmVar20,(char *)__modes);
                return (int)pFVar16;
              }
              cVar1 = (char)__modes->n_rows;
              if (cVar1 == 'w') {
                puVar17 = (undefined8 *)&stdout;
              }
              else {
                if (cVar1 != 'r') {
                  open_file_std_cold_1();
                  iVar6 = (int)__modes;
                  if ((0 < iVar6) && (0 < (int)uVar22)) {
                    piVar18 = (int *)chk_alloc(1,0x20);
                    *piVar18 = iVar6;
                    piVar18[1] = uVar22;
                    piVar18[2] = iVar6 + 0x1fU >> 5;
                    pvVar11 = chk_alloc(uVar22,8);
                    *(void **)(piVar18 + 4) = pvVar11;
                    pvVar11 = chk_alloc(piVar18[1] * piVar18[2],4);
                    *(void **)(piVar18 + 6) = pvVar11;
                    iVar6 = piVar18[1];
                    if (0 < (long)iVar6) {
                      iVar7 = piVar18[2];
                      lVar13 = 0;
                      lVar14 = 0;
                      do {
                        *(long *)(*(long *)(piVar18 + 4) + lVar14 * 8) =
                             *(long *)(piVar18 + 6) + lVar13;
                        lVar14 = lVar14 + 1;
                        lVar13 = lVar13 + (long)iVar7 * 4;
                      } while (iVar6 != lVar14);
                    }
                    return (int)piVar18;
                  }
                  mod2dense_allocate_cold_1();
                  free(__modes->blocks);
                  free(__modes->cols);
                  free(__modes);
                  return extraout_EAX;
                }
                puVar17 = (undefined8 *)&stdin;
              }
              return (int)*puVar17;
            }
            lVar14 = lVar14 + 1;
          } while (lVar13 != lVar14);
        }
        if (0 < pmVar20->n_rows) {
          do {
            lVar14 = lVar13 + -1;
            if (__modes == (mod2sparse *)0x0) {
              iVar6 = (int)lVar14;
            }
            else {
              iVar6 = *(int *)((long)__modes + lVar14 * 4);
            }
            pmVar15 = pmVar20->rows[lVar14].right;
            if (pmVar15->row < 0) {
              bVar5 = true;
              bVar27 = 0;
            }
            else {
              bVar5 = false;
              bVar27 = 0;
              do {
                if (pmVar15->col == iVar6) {
                  bVar5 = true;
                }
                else {
                  bVar27 = bVar27 ^ *(byte *)((long)&pmVar12->n_rows + (long)pmVar15->col);
                }
                pmVar15 = pmVar15->right;
              } while (-1 < pmVar15->row);
              bVar5 = !bVar5;
            }
            if ((bVar5) && (bVar27 != *(byte *)(extraout_RDX_02 + lVar14))) {
              return 0;
            }
            *(byte *)((long)&pmVar12->n_rows + (long)iVar6) =
                 bVar27 ^ *(byte *)(extraout_RDX_02 + -1 + lVar13);
            bVar5 = 1 < lVar13;
            lVar13 = lVar14;
          } while (bVar5);
        }
        return 1;
      }
      uVar25 = uVar25 + 1;
    } while (uVar24 != uVar25);
  }
  if (0 < pmVar20->n_cols) {
    uVar25 = 0;
    do {
      if (__modes == (mod2sparse *)0x0) {
        iVar6 = (int)uVar25;
      }
      else {
        iVar6 = (&__modes->n_rows)[uVar25];
      }
      lVar13 = (long)iVar6;
      pmVar15 = pmVar20->rows[lVar13].right;
      if (pmVar15->row < 0) {
        bVar5 = true;
        bVar27 = 0;
      }
      else {
        bVar5 = false;
        bVar27 = 0;
        do {
          if (uVar25 == (uint)pmVar15->col) {
            bVar5 = true;
          }
          else {
            bVar27 = bVar27 ^ *(byte *)((long)&pmVar12->n_rows + (long)pmVar15->col);
          }
          pmVar15 = pmVar15->right;
        } while (-1 < pmVar15->row);
        bVar5 = !bVar5;
      }
      if ((bVar5) && (bVar27 != *(byte *)(extraout_RDX_01 + lVar13))) {
        return 0;
      }
      *(byte *)((long)&pmVar12->n_rows + uVar25) = bVar27 ^ *(byte *)(extraout_RDX_01 + lVar13);
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar24);
  }
  return 1;
}

Assistant:

int mod2sparse_count_col
( mod2sparse *m,
  int col
)
{
  mod2entry *e;
  int count;

  if (col<0 || col>=mod2sparse_cols(m))
  { fprintf(stderr,"mod2sparse_count_col: column index out of bounds\n");
    exit(1);
  }

  count = 0;

  for (e = mod2sparse_first_in_col(m,col);
       !mod2sparse_at_end(e);
       e = mod2sparse_next_in_col(e))
  { count += 1;
  }

  return count;
}